

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::retranslateStrings(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  Ui_QFileDialog *pUVar1;
  QAction *pQVar2;
  char cVar3;
  int iVar4;
  QWidget *this_01;
  int iVar5;
  QAbstractProxyModel *pQVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QStringBuilder<QString,_QString> local_c0;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<QAction_*> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  cVar3 = QFileDialogOptions::useDefaultNameFilters();
  if (cVar3 != '\0') {
    QFileDialogOptions::defaultNameFilterString();
    QFileDialog::setNameFilter(this_00,&local_c0.a);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
  }
  pUVar1 = (this->qFileDialogUi).d;
  if (pUVar1 != (Ui_QFileDialog *)0x0 && (this->super_QDialogPrivate).nativeDialogInUse == false) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    this_01 = (QWidget *)QTreeView::header(&pUVar1->treeView->super_QTreeView);
    QWidget::actions((QList<QAction_*> *)&local_78,this_01);
    pQVar6 = this->proxyModel;
    if (pQVar6 == (QAbstractProxyModel *)0x0) {
      pQVar6 = (QAbstractProxyModel *)this->model;
    }
    local_c0.a.d.d = (Data *)0xffffffffffffffff;
    local_c0.a.d.ptr = (char16_t *)0x0;
    local_c0.a.d.size = 0;
    iVar4 = (**(code **)(*(long *)pQVar6 + 0x80))();
    iVar5 = (int)local_78.size + 1;
    if (iVar4 < (int)local_78.size + 1) {
      iVar5 = iVar4;
    }
    for (uVar7 = 1; (long)uVar7 < (long)iVar5; uVar7 = uVar7 + 1) {
      pQVar2 = local_78.ptr[uVar7 - 1];
      QFileDialog::tr((QString *)&local_d8,"Show ",(char *)0x0,-1);
      (**(code **)(*(long *)pQVar6 + 0xa0))(&local_58,pQVar6,uVar7 & 0xffffffff,1,0);
      ::QVariant::toString();
      QStringBuilder<QString,_QString>::QStringBuilder
                (&local_c0,(QString *)&local_d8,(QString *)&local_f0);
      QStringBuilder<QString,_QString>::convertTo<QString>((QString *)&local_90,&local_c0);
      QAction::setText((QString *)pQVar2);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QStringBuilder<QString,_QString>::~QStringBuilder(&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
      ::QVariant::~QVariant(&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    }
    pQVar2 = this->renameAction;
    QFileDialog::tr(&local_c0.a,"&Rename",(char *)0x0,-1);
    QAction::setText((QString *)pQVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
    pQVar2 = this->deleteAction;
    QFileDialog::tr(&local_c0.a,"&Delete",(char *)0x0,-1);
    QAction::setText((QString *)pQVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
    pQVar2 = this->showHiddenAction;
    QFileDialog::tr(&local_c0.a,"Show &hidden files",(char *)0x0,-1);
    QAction::setText((QString *)pQVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
    pQVar2 = this->newFolderAction;
    QFileDialog::tr(&local_c0.a,"&New Folder",(char *)0x0,-1);
    QAction::setText((QString *)pQVar2);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c0);
    Ui_QFileDialog::retranslateUi((this->qFileDialogUi).d,&this_00->super_QDialog);
    updateLookInLabel(this);
    updateFileNameLabel(this);
    updateFileTypeLabel(this);
    updateCancelButtonText(this);
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::retranslateStrings()
{
    Q_Q(QFileDialog);
    /* WIDGETS */
    if (options->useDefaultNameFilters())
        q->setNameFilter(QFileDialogOptions::defaultNameFilterString());
    if (!usingWidgets())
        return;

    QList<QAction*> actions = qFileDialogUi->treeView->header()->actions();
    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    const int total = qMin(abstractModel->columnCount(QModelIndex()), int(actions.size() + 1));
    for (int i = 1; i < total; ++i) {
        actions.at(i - 1)->setText(QFileDialog::tr("Show ") + abstractModel->headerData(i, Qt::Horizontal, Qt::DisplayRole).toString());
    }

    /* MENU ACTIONS */
    renameAction->setText(QFileDialog::tr("&Rename"));
    deleteAction->setText(QFileDialog::tr("&Delete"));
    showHiddenAction->setText(QFileDialog::tr("Show &hidden files"));
    newFolderAction->setText(QFileDialog::tr("&New Folder"));
    qFileDialogUi->retranslateUi(q);
    updateLookInLabel();
    updateFileNameLabel();
    updateFileTypeLabel();
    updateCancelButtonText();
}